

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::Symbol::GetVisibilityError_abi_cxx11_
          (string *__return_storage_ptr__,Symbol *this,FileDescriptor *other,string_view usage)

{
  uint8_t uVar1;
  SymbolVisibility SVar2;
  FileDescriptor *pFVar3;
  FeatureSet *pFVar4;
  string *psVar5;
  char *pcVar6;
  AlphaNum *c;
  AlphaNum *in_R9;
  string_view sVar7;
  char (*in_stack_fffffffffffffe88) [45];
  size_type local_170;
  string_view usage_local;
  string reason;
  string_view local_130 [3];
  size_type local_100;
  pointer local_f8;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  c = (AlphaNum *)usage._M_str;
  usage_local._M_len = usage._M_len;
  usage_local._M_str = (char *)c;
  pFVar3 = GetFile(this);
  if (pFVar3 == (FileDescriptor *)0x0) {
    local_170 = 0xc;
    pcVar6 = "unknown_file";
  }
  else {
    pFVar3 = GetFile(this);
    pcVar6 = (pFVar3->name_->_M_dataplus)._M_p;
    local_170 = pFVar3->name_->_M_string_length;
  }
  sVar7 = full_name(this);
  uVar1 = this->ptr_->symbol_type_;
  local_f0.piece_._M_str = pcVar6;
  if ((uVar1 == '\x01') || (uVar1 == '\x04')) {
    SVar2 = visibility_keyword(this);
    if (SVar2 == VISIBILITY_LOCAL) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&reason,"It is explicitly marked \'local\'",(allocator<char> *)&local_f0)
      ;
    }
    else {
      local_130[0] = absl::lts_20250127::NullSafeStringView
                               (
                               "It defaulted to local from file-level \'option features.default_symbol_visibility = \'"
                               );
      pFVar4 = features(this);
      psVar5 = internal::
               NameOfDenseEnum<&google::protobuf::FeatureSet_VisibilityFeature_DefaultSymbolVisibility_descriptor,0,4>
                         ((pFVar4->field_0)._impl_.default_symbol_visibility_);
      local_90.piece_._M_str = (psVar5->_M_dataplus)._M_p;
      local_90.piece_._M_len = psVar5->_M_string_length;
      local_c0.piece_ = absl::lts_20250127::NullSafeStringView("\';");
      absl::lts_20250127::StrCat_abi_cxx11_(&reason,(lts_20250127 *)local_130,&local_90,&local_c0,c)
      ;
    }
    local_130[0] = absl::lts_20250127::NullSafeStringView("Symbol \"");
    local_90.piece_ = sVar7;
    local_c0.piece_ = absl::lts_20250127::NullSafeStringView("\", defined in \"");
    local_f0.piece_._M_len = local_170;
    local_60.piece_ = absl::lts_20250127::NullSafeStringView("\" ");
    local_f8 = (other->name_->_M_dataplus)._M_p;
    local_100 = other->name_->_M_string_length;
    absl::lts_20250127::
    StrCat<std::basic_string_view<char,std::char_traits<char>>,char[23],std::basic_string_view<char,std::char_traits<char>>,char[4],std::__cxx11::string,char[45]>
              (__return_storage_ptr__,(lts_20250127 *)local_130,&local_90,&local_c0,&local_f0,
               &local_60,(AlphaNum *)&usage_local,
               (basic_string_view<char,_std::char_traits<char>_> *)" is not visible from \"",
               (char (*) [23])&local_100,(basic_string_view<char,_std::char_traits<char>_> *)"\". ",
               (char (*) [4])&reason,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               " and cannot be accessed outside its own file",in_stack_fffffffffffffe88);
    std::__cxx11::string::~string((string *)&reason);
  }
  else {
    local_130[0] = absl::lts_20250127::NullSafeStringView
                             ("Attempt to get a visibility error for a non-message/enum symbol ");
    local_90.piece_ = sVar7;
    local_c0.piece_ = absl::lts_20250127::NullSafeStringView("\", defined in \"");
    local_f0.piece_._M_len = local_170;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)local_130,&local_90,&local_c0,&local_f0,in_R9)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetVisibilityError(FileDescriptor* other,
                                 absl::string_view usage = "") const {
    const absl::string_view file_path =
        GetFile() != nullptr ? GetFile()->name() : "unknown_file";
    const absl::string_view symbol_name = full_name();

    if (!IsType()) {
      return absl::StrCat(
          "Attempt to get a visibility error for a non-message/enum symbol ",
          symbol_name, "\", defined in \"", file_path);
    }

    SymbolVisibility explicit_visibility = visibility_keyword();

    std::string reason =
        explicit_visibility == SymbolVisibility::VISIBILITY_LOCAL
            ? "It is explicitly marked 'local'"
            : absl::StrCat(
                  "It defaulted to local from file-level 'option "
                  "features.default_symbol_visibility = '",
                  FeatureSet_VisibilityFeature_DefaultSymbolVisibility_Name(
                      features().default_symbol_visibility()),
                  "';");

    return absl::StrCat("Symbol \"", symbol_name, "\", defined in \"",
                        file_path, "\" ", usage,
                        " is "
                        "not visible from \"",
                        other->name(), "\". ", reason,
                        " and cannot be accessed outside its own file");
  }